

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_prec.c
# Opt level: O2

int f(sunrealtype t,N_Vector c,N_Vector cdot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  sunrealtype in_XMM2_Qa;
  
  lVar7 = N_VGetArrayPointer();
  lVar8 = N_VGetArrayPointer(cdot);
  uVar4 = *(uint *)((long)user_data + 0x40);
  iVar5 = *(int *)((long)user_data + 0x44);
  dVar1 = *(double *)((long)user_data + 0x2a0);
  dVar2 = *(double *)((long)user_data + 0x2a8);
  iVar18 = 0;
  uVar13 = 0;
  if (0 < (int)uVar4) {
    uVar13 = (ulong)uVar4;
  }
  for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
    iVar16 = iVar5;
    if (lVar11 == 5) {
      iVar16 = -iVar5;
    }
    iVar17 = iVar5;
    if (lVar11 != 0) {
      iVar17 = -iVar5;
    }
    iVar17 = iVar17 + iVar18;
    iVar16 = iVar16 + iVar18;
    iVar19 = iVar18;
    for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
      lVar10 = lVar15 * (int)uVar4 + lVar11 * iVar5;
      WebRates((double)(int)lVar15 * dVar1,(double)(int)lVar11 * dVar2,in_XMM2_Qa,
               (sunrealtype *)(lVar7 + lVar10 * 8),
               (sunrealtype *)((long)user_data + lVar10 * 8 + 0x2b8),(WebData)user_data);
      uVar14 = uVar4;
      if (lVar15 == 5) {
        uVar14 = -uVar4;
      }
      uVar9 = -uVar4;
      if (lVar15 == 0) {
        uVar9 = uVar4;
      }
      for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        iVar6 = (int)uVar12;
        lVar10 = (long)(iVar19 + iVar6);
        dVar3 = *(double *)(lVar7 + lVar10 * 8);
        in_XMM2_Qa = dVar3 - *(double *)(lVar7 + (long)(int)(uVar9 + iVar19 + iVar6) * 8);
        *(double *)(lVar8 + lVar10 * 8) =
             ((*(double *)(lVar7 + (long)(iVar16 + iVar6) * 8) - dVar3) -
             (dVar3 - *(double *)(lVar7 + (long)(iVar6 + iVar17) * 8))) *
             *(double *)((long)user_data + uVar12 * 8 + 0x270) +
             ((*(double *)(lVar7 + (long)(int)(uVar14 + iVar19 + iVar6) * 8) - dVar3) - in_XMM2_Qa)
             * *(double *)((long)user_data + uVar12 * 8 + 0x240) +
             *(double *)((long)user_data + lVar10 * 8 + 0x2b8);
      }
      iVar19 = iVar19 + uVar4;
      iVar17 = iVar17 + uVar4;
      iVar16 = iVar16 + uVar4;
    }
    iVar18 = iVar18 + iVar5;
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector c, N_Vector cdot, void* user_data)
{
  int i, ic, ici, idxl, idxu, jx, ns, mxns, iyoff, jy, idyu, idyl;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, dx, dy;
  sunrealtype *cdata, *cdotdata;
  WebData wdata;

  wdata    = (WebData)user_data;
  cdata    = N_VGetArrayPointer(c);
  cdotdata = N_VGetArrayPointer(cdot);

  mxns  = wdata->mxns;
  ns    = wdata->ns;
  fsave = wdata->fsave;
  cox   = wdata->cox;
  coy   = wdata->coy;
  mxns  = wdata->mxns;
  dx    = wdata->dx;
  dy    = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRates(x, y, t, cdata + ic, fsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cdata[ici] - cdata[ici - idyl];
        dcyui = cdata[ici + idyu] - cdata[ici];
        /* Do differencing in x. */
        dcxli = cdata[ici] - cdata[ici - idxl];
        dcxui = cdata[ici + idxu] - cdata[ici];
        /* Collect terms and load cdot elements. */
        cdotdata[ici] = coy[i - 1] * (dcyui - dcyli) +
                        cox[i - 1] * (dcxui - dcxli) + fsave[ici];
      }
    }
  }

  return (0);
}